

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist.cpp
# Opt level: O3

int SetPosition(LinkedList *L,int pos)

{
  node *pnVar1;
  Node *pNVar2;
  int iVar3;
  
  iVar3 = -1;
  if (L->size != 0) {
    if (pos < 0 || L->size <= pos) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"position error!",0xf);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
      std::ostream::put(-0x70);
      std::ostream::flush();
    }
    else {
      L->currPtr = L->front;
      L->prevPtr = (Node *)0x0;
      L->position = 0;
      pnVar1 = L->front;
      iVar3 = pos;
      if (pos == 0) {
        iVar3 = 0;
      }
      else {
        do {
          pNVar2 = pnVar1;
          pnVar1 = pNVar2->next;
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
        L->position = pos;
        L->currPtr = pnVar1;
        L->prevPtr = pNVar2;
        iVar3 = pos;
      }
    }
  }
  return iVar3;
}

Assistant:

int SetPosition(LinkedList *L, int pos) { //重置链表当前结点位置的函数
    if(!L->size) return -1;  //链表为空
    if(pos<0 || pos>L->size-1) {
        cout << "position error!" << endl;
        return -1;
    }
    //寻找对应结点
    L->currPtr = L->front;
    L->prevPtr = NULL;
    L->position = 0;
    for(int i = 0; i < pos; i++) {
        L->position++;
        L->prevPtr = L->currPtr;
        L->currPtr = (L->currPtr)->next;
    }
    return L->position;  //返回当前结点位置
}